

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *_config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  IConfig *pIVar1;
  IMutableContext *pIVar2;
  IStreamingReporter *pIVar3;
  string local_40 [32];
  Ptr<Catch::IStreamingReporter> *local_20;
  Ptr<Catch::IStreamingReporter> *reporter_local;
  Ptr<const_Catch::IConfig> *_config_local;
  RunContext *this_local;
  
  local_20 = reporter;
  reporter_local = (Ptr<Catch::IStreamingReporter> *)_config;
  _config_local = (Ptr<const_Catch::IConfig> *)this;
  IResultCapture::IResultCapture(&this->super_IResultCapture);
  IRunner::IRunner(&this->super_IRunner);
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0019d050;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_0019d0c0;
  pIVar1 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)reporter_local);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_40);
  TestRunInfo::TestRunInfo(&this->m_runInfo,local_40);
  std::__cxx11::string::~string((string *)local_40);
  pIVar2 = getCurrentMutableContext();
  this->m_context = pIVar2;
  this->m_activeTestCase = (TestCase *)0x0;
  AssertionResult::AssertionResult(&this->m_lastResult);
  Ptr<const_Catch::IConfig>::Ptr(&this->m_config,(Ptr<const_Catch::IConfig> *)reporter_local);
  Totals::Totals(&this->m_totals);
  Ptr<Catch::IStreamingReporter>::Ptr(&this->m_reporter,local_20);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector(&this->m_messages);
  AssertionInfo::AssertionInfo(&this->m_lastAssertionInfo);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            (&this->m_unfinishedSections);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector(&this->m_activeSections);
  TestCaseTracking::TrackerContext::TrackerContext(&this->m_trackerContext);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])();
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar3,&this->m_runInfo);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& _config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( _config->name() ),
            m_context( getCurrentMutableContext() ),
            m_activeTestCase( CATCH_NULL ),
            m_config( _config ),
            m_reporter( reporter )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }